

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_variable_temporary_copies(CompilerGLSL *this,SPIRVariable *var)

{
  ID *ts;
  size_type sVar1;
  SPIRType *type;
  Bitset *flags;
  char (*in_R8) [6];
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (var->allocate_temporary_copy == true) {
    local_88._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
    sVar1 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->flushed_phi_variables)._M_h,(key_type *)&local_88);
    if (sVar1 == 0) {
      ts = &(var->super_IVariant).self;
      type = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
      flags = Compiler::get_decoration_bitset
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id);
      flags_to_qualifiers_glsl_abi_cxx11_(&local_88,this,type,flags);
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
                (&local_68,(spirv_cross *)0x282e15,(char (*) [2])ts,
                 (TypedID<(spirv_cross::Types)0> *)0x27e658,in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_48,this,type,&local_68,0);
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (this,&local_88,&local_48,(char (*) [2])0x297c5b);
      ::std::__cxx11::string::~string((string *)&local_48);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
      local_88._M_dataplus._M_p._0_4_ = ts->id;
      ::std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->flushed_phi_variables,(value_type *)&local_88);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_variable_temporary_copies(const SPIRVariable &var)
{
	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	if (var.allocate_temporary_copy && !flushed_phi_variables.count(var.self))
	{
		auto &type = get<SPIRType>(var.basetype);
		auto &flags = get_decoration_bitset(var.self);
		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, join("_", var.self, "_copy")), ";");
		flushed_phi_variables.insert(var.self);
	}
}